

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O0

void __thiscall tst_helpers_connect::resolveOneSenderManyArgs(tst_helpers_connect *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  bool local_72;
  bool local_71;
  int local_70;
  bool local_6a;
  bool local_69 [7];
  bool local_62;
  bool local_61;
  code *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> p;
  type local_30;
  undefined1 local_28 [8];
  Object sender;
  tst_helpers_connect *this_local;
  
  sender._16_8_ = this;
  Object::Object((Object *)local_28);
  local_30.sender = (Object *)local_28;
  QtPromisePrivate::qtpromise_defer<tst_helpers_connect::resolveOneSenderManyArgs()::__0>(&local_30)
  ;
  local_60 = Object::twoArgsSignal;
  local_58 = 0;
  QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
            ((Object *)local_50,(offset_in_Object_to_subr)local_28);
  local_61 = Object::hasConnections((Object *)local_28);
  local_62 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_61,&local_62,"sender.hasConnections()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x4f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_69[0] = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_50);
    local_6a = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_69,&local_6a,"p.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_70 = -1;
      iVar3 = waitForValue<int>((QPromise<int> *)local_50,&local_70);
      bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                              ,0x51);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        local_71 = Object::hasConnections((Object *)local_28);
        local_72 = false;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_71,&local_72,"sender.hasConnections()","false",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                           ,0x52);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_69[1] = false;
          local_69[2] = false;
          local_69[3] = false;
          local_69[4] = false;
        }
        else {
          local_69[1] = true;
          local_69[2] = false;
          local_69[3] = false;
          local_69[4] = false;
        }
      }
      else {
        local_69[1] = true;
        local_69[2] = false;
        local_69[3] = false;
        local_69[4] = false;
      }
    }
    else {
      local_69[1] = true;
      local_69[2] = false;
      local_69[3] = false;
      local_69[4] = false;
    }
  }
  else {
    local_69[1] = true;
    local_69[2] = false;
    local_69[3] = false;
    local_69[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_50);
  Object::~Object((Object *)local_28);
  return;
}

Assistant:

void tst_helpers_connect::resolveOneSenderManyArgs()
{
    Object sender;
    QtPromisePrivate::qtpromise_defer([&]() {
        Q_EMIT sender.twoArgsSignal(42, "foo");
    });

    auto p = QtPromise::connect(&sender, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(sender.hasConnections(), false);
}